

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O0

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<int,_int>,_3UL>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<int,_int>,_3UL>_>_>
         *this)

{
  long *plVar1;
  long in_RDI;
  CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<int,_int>,_3UL>_> obj;
  code *local_68;
  long local_38 [7];
  
  anon_unknown.dwarf_70180c::
  CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<int,_int>,_3UL>_>::
  CATCH2_INTERNAL_TEMPLATE_TEST_174
            ((CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<int,_int>,_3UL>_> *)
             0x92420d);
  local_68 = *(code **)(in_RDI + 8);
  plVar1 = (long *)((long)local_38 + *(long *)(in_RDI + 0x10));
  if (((ulong)local_68 & 1) != 0) {
    local_68 = *(code **)(local_68 + *plVar1 + -1);
  }
  (*local_68)(plVar1);
  anon_unknown.dwarf_70180c::
  CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<int,_int>,_3UL>_>::
  ~CATCH2_INTERNAL_TEMPLATE_TEST_174
            ((CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<int,_int>,_3UL>_> *)
             0x924271);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }